

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void add_intrinsic_4f_s3_3f_3f_3f(Context_conflict *ctx,char *fn)

{
  MOJOSHADER_astDataType *ret;
  MOJOSHADER_astDataType *dt2;
  MOJOSHADER_astDataType *f3;
  MOJOSHADER_astDataType *f4;
  char *fn_local;
  Context_conflict *ctx_local;
  
  ret = get_usertype(ctx,"float4");
  dt2 = get_usertype(ctx,"float3");
  add_intrinsic4(ctx,fn,ret,&ctx->dt_sampler3d,dt2,dt2,dt2);
  return;
}

Assistant:

static void add_intrinsic_4f_s3_3f_3f_3f(Context *ctx, const char *fn)
{
    const MOJOSHADER_astDataType *f4 = get_usertype(ctx, "float4");
    const MOJOSHADER_astDataType *f3 = get_usertype(ctx, "float3");
    add_intrinsic4(ctx, fn, f4, &ctx->dt_sampler3d, f3, f3, f3);
}